

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O3

string * __thiscall
(anonymous_namespace)::gtest_AllECCurveTest_EvalGenerateName__abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TestParamInfo<int> *info)

{
  bool bVar1;
  char *__s;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  long local_30;
  testing local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) goto LAB_002cc25f;
  anon_unknown.dwarf_5c5a51::AllCurves();
  testing::ValuesIn<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
            (local_28,local_40,local_38);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_20->_M_use_count = local_20->_M_use_count + 1;
      UNLOCK();
      if (local_20 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_002cc23b;
    }
    else {
      local_20->_M_use_count = local_20->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
LAB_002cc23b:
  if (local_40._M_current != (int *)0x0) {
    operator_delete(local_40._M_current,local_30 - (long)local_40._M_current);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
LAB_002cc25f:
  __s = OBJ_nid2sn(*(int *)this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

static const EC_GROUP *GetCurve(FileTest *t, const char *key) {
  std::string curve_name;
  if (!t->GetAttribute(&curve_name, key)) {
    return nullptr;
  }

  if (curve_name == "P-224") {
    return EC_group_p224();
  }
  if (curve_name == "P-256") {
    return EC_group_p256();
  }
  if (curve_name == "P-384") {
    return EC_group_p384();
  }
  if (curve_name == "P-521") {
    return EC_group_p521();
  }

  t->PrintLine("Unknown curve '%s'", curve_name.c_str());
  return nullptr;
}